

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O0

void __thiscall
GlobOpt::ArrayLowerBoundCheckHoistInfo::SetLoop
          (ArrayLowerBoundCheckHoistInfo *this,Loop *loop,int indexConstantValue,
          bool isLoopCountBasedBound)

{
  code *pcVar1;
  bool bVar2;
  BasicBlock *pBVar3;
  undefined4 *puVar4;
  IntConstantBounds local_28;
  byte local_1d;
  int local_1c;
  bool isLoopCountBasedBound_local;
  Loop *pLStack_18;
  int indexConstantValue_local;
  Loop *loop_local;
  ArrayLowerBoundCheckHoistInfo *this_local;
  
  local_1d = isLoopCountBasedBound;
  local_1c = indexConstantValue;
  pLStack_18 = loop;
  loop_local = (Loop *)this;
  pBVar3 = CompatibleBoundCheckBlock(this);
  if (pBVar3 != (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x42,"(!CompatibleBoundCheckBlock())","!CompatibleBoundCheckBlock()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (pLStack_18 == (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x43,"(loop)","loop");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this->loop = pLStack_18;
  this->indexSym = (StackSym *)0x0;
  this->offset = 0;
  this->indexValue = (Value *)0x0;
  IntConstantBounds::IntConstantBounds(&local_28,local_1c,local_1c);
  this->indexConstantBounds = local_28;
  this->isLoopCountBasedBound = (bool)(local_1d & 1);
  this->loopCount = (LoopCount *)0x0;
  return;
}

Assistant:

void GlobOpt::ArrayLowerBoundCheckHoistInfo::SetLoop(
    ::Loop *const loop,
    const int indexConstantValue,
    const bool isLoopCountBasedBound)
{
    Assert(!CompatibleBoundCheckBlock());
    Assert(loop);

    this->loop = loop;
    indexSym = nullptr;
    offset = 0;
    indexValue = nullptr;
    indexConstantBounds = IntConstantBounds(indexConstantValue, indexConstantValue);
    this->isLoopCountBasedBound = isLoopCountBasedBound;
    loopCount = nullptr;
}